

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O1

void decode_performance_tests(int loop_count)

{
  jpegls_errc error_value;
  ostream *poVar1;
  size_t __n;
  long lVar2;
  long lVar3;
  int iVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_source;
  vector<unsigned_char,_std::allocator<unsigned_char>_> destination;
  jpegls_decoder decoder;
  allocator_type local_f9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  double local_c8;
  jpegls_decoder local_c0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Test decode performance with loop count ",0x28);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,loop_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  read_file(&local_f8,"decodetest.jls",0,0);
  charls::jpegls_decoder::jpegls_decoder
            (&local_c0,
             local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,true);
  __n = charls::jpegls_decoder::destination_size(&local_c0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,__n,&local_f9);
  if (local_c0.application_data_handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.application_data_handler_.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.application_data_handler_,
               (_Any_data *)&local_c0.application_data_handler_,__destroy_functor);
  }
  if (local_c0.comment_handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.comment_handler_.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.comment_handler_,(_Any_data *)&local_c0.comment_handler_,
               __destroy_functor);
  }
  if (local_c0.decoder_._M_t.
      super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>._M_t.
      super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>.
      super__Head_base<0UL,_charls_jpegls_decoder_*,_false>._M_head_impl !=
      (charls_jpegls_decoder *)0x0) {
    (*(code *)local_c0.decoder_._M_t.
              super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>.
              _M_t.
              super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>
              .super__Tuple_impl<1UL,_void_(*)(const_charls_jpegls_decoder_*)>.
              super__Head_base<1UL,_void_(*)(const_charls_jpegls_decoder_*),_false>._M_head_impl)
              (local_c0.decoder_._M_t.
               super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>
               ._M_t.
               super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>
               .super__Head_base<0UL,_charls_jpegls_decoder_*,_false>._M_head_impl);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  if (loop_count != 0) {
    iVar4 = loop_count;
    do {
      charls::jpegls_decoder::jpegls_decoder
                (&local_c0,
                 local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,true);
      error_value = charls_jpegls_decoder_decode_to_buffer
                              (local_c0.decoder_._M_t.
                               super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>
                               ._M_t.
                               super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>
                               .super__Head_base<0UL,_charls_jpegls_decoder_*,_false>._M_head_impl,
                               local_e0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_e0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_e0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0);
      if (error_value != OK) {
        charls::impl::throw_jpegls_error(error_value);
      }
      if (local_c0.application_data_handler_.super__Function_base._M_manager != (_Manager_type)0x0)
      {
        (*local_c0.application_data_handler_.super__Function_base._M_manager)
                  ((_Any_data *)&local_c0.application_data_handler_,
                   (_Any_data *)&local_c0.application_data_handler_,__destroy_functor);
      }
      if (local_c0.comment_handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_c0.comment_handler_.super__Function_base._M_manager)
                  ((_Any_data *)&local_c0.comment_handler_,(_Any_data *)&local_c0.comment_handler_,
                   __destroy_functor);
      }
      if (local_c0.decoder_._M_t.
          super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>._M_t
          .super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>.
          super__Head_base<0UL,_charls_jpegls_decoder_*,_false>._M_head_impl !=
          (charls_jpegls_decoder *)0x0) {
        (*(code *)local_c0.decoder_._M_t.
                  super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>
                  ._M_t.
                  super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>
                  .super__Tuple_impl<1UL,_void_(*)(const_charls_jpegls_decoder_*)>.
                  super__Head_base<1UL,_void_(*)(const_charls_jpegls_decoder_*),_false>._M_head_impl
        )(local_c0.decoder_._M_t.
          super___uniq_ptr_impl<charls_jpegls_decoder,_void_(*)(const_charls_jpegls_decoder_*)>._M_t
          .super__Tuple_impl<0UL,_charls_jpegls_decoder_*,_void_(*)(const_charls_jpegls_decoder_*)>.
          super__Head_base<0UL,_charls_jpegls_decoder_*,_false>._M_head_impl);
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total decoding time is: ",0x18);
  local_c8 = (double)(lVar3 - lVar2) / 1000000.0;
  poVar1 = std::ostream::_M_insert<double>(local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Decoding time per image: ",0x19);
  poVar1 = std::ostream::_M_insert<double>(local_c8 / (double)loop_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decode_performance_tests(const int loop_count)
{
    cout << "Test decode performance with loop count " << loop_count << "\n";

    try
    {
        // This test expect the file decodetest.jls to exist.
        // It can be any valid JPEG-LS file.
        // Changing the content of this file allows different performance measurements.
        const vector<uint8_t> encoded_source{read_file("decodetest.jls")};

        // Pre-allocate the destination outside the measurement loop.
        // std::vector initializes its elements and this step needs to be excluded from the measurement.
        vector<uint8_t> destination(jpegls_decoder{encoded_source, true}.destination_size());

        const auto start{steady_clock::now()};
        for (int i{}; i != loop_count; ++i)
        {
            const jpegls_decoder decoder{encoded_source, true};

            decoder.decode(destination);
        }

        const auto end{steady_clock::now()};
        const auto diff{end - start};
        cout << "Total decoding time is: " << duration<double, milli>(diff).count() << " ms\n";
        cout << "Decoding time per image: " << duration<double, milli>(diff).count() / loop_count << " ms\n";
    }
    catch (const jpegls_error& e)
    {
        cout << "Decode failure: " << e.what() << "\n";
    }
    catch (const std::ios_base::failure& e)
    {
        cout << "IO failure (missing decodetest.jls?): " << e.what() << "\n";
    }
}